

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

RealType __thiscall
OpenMD::EAM::PhiCoreCore(EAM *this,RealType r,RealType re,RealType A,RealType alpha,RealType kappa)

{
  EAMMixingMethod EVar1;
  double dVar2;
  RealType RVar3;
  
  EVar1 = this->mixMeth_;
  if ((EVar1 == eamJohnson) || (EVar1 == eamDream1)) {
    dVar2 = exp((r / re + -1.0) * -alpha);
    RVar3 = fastPower(this,r / re - kappa,0x14);
    RVar3 = (dVar2 * A) / (RVar3 + 1.0);
  }
  else {
    RVar3 = 0.0;
    if (EVar1 == eamDream2) {
      dVar2 = exp((r / re + -1.0) * -alpha);
      RVar3 = fastPower(this,1.0 / (r + 1e-05),0x1e);
      RVar3 = RVar3 * 0.02 + A * dVar2;
    }
  }
  return RVar3;
}

Assistant:

RealType EAM::PhiCoreCore(RealType r, RealType re, RealType A, RealType alpha,
                            RealType kappa) {
    if (mixMeth_ == eamDream2) {
      RealType a     = 0.02;
      RealType sigma = 1;
      return (A * exp(-alpha * (r / re - 1.0)) +
              a * fastPower(sigma / (r + 1e-5), 30));
    }

    else if ((mixMeth_ == eamDream1) || (mixMeth_ == eamJohnson)) {
      return (A * exp(-alpha * (r / re - 1.0))) /
             (1.0 + fastPower(r / re - kappa, 20));
    }

    else
      return 0;
  }